

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

bool __thiscall pbrt::syntactic::ParamSet::getParam3f(ParamSet *this,float *result,string *name)

{
  float *pfVar1;
  int iVar2;
  const_iterator cVar3;
  undefined4 extraout_var;
  runtime_error *prVar4;
  _Rb_tree_header *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> p;
  shared_ptr<pbrt::syntactic::Param> pr;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                  *)this,name);
  p_Var5 = &(this->param)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node != p_Var5) {
    std::__shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pr.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2> *)
               (cVar3._M_node + 2));
    std::dynamic_pointer_cast<pbrt::syntactic::ParamArray<float>,pbrt::syntactic::Param>
              ((shared_ptr<pbrt::syntactic::Param> *)&p);
    if (p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_90,"found param of given name, but of wrong type! (name was \'",name);
      std::operator+(&local_70,&local_90,"\'");
      std::runtime_error::runtime_error(prVar4,(string *)&local_70);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = (*((p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Param)._vptr_Param[1])();
    if (CONCAT44(extraout_var,iVar2) != 3) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_90,
                     "found param of given name and type, but wrong number of components! (3f, name=\'"
                     ,name);
      std::operator+(&local_70,&local_90,"\'");
      std::runtime_error::runtime_error(prVar4,(string *)&local_70);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pfVar1 = ((p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    *result = *pfVar1;
    result[1] = pfVar1[1];
    result[2] = pfVar1[2];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pr.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return (_Rb_tree_header *)cVar3._M_node != p_Var5;
}

Assistant:

bool ParamSet::getParam3f(float *result, const std::string &name) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return 0;
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<float>> p = std::dynamic_pointer_cast<ParamArray<float>>(pr);
      if (!p)
        throw std::runtime_error("found param of given name, but of wrong type! (name was '"+name+"'");
      if (p->getSize() != 3)
        throw std::runtime_error("found param of given name and type, but wrong number of components! (3f, name='"+name+"'");
      result[0] = p->get(0);
      result[1] = p->get(1);
      result[2] = p->get(2);
      return true;
    }